

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc3.c
# Opt level: O3

int Saig_ManBmcRunTerSim_rec(Gia_ManBmc_t *p,Aig_Obj_t *pObj,int iFrame)

{
  int iVar1;
  uint uVar2;
  void *pvVar3;
  Aig_Man_t *pAVar4;
  byte bVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  
  if ((iFrame < 0) || (p->vTerInfo->nSize <= iFrame)) {
LAB_00569a15:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  pvVar3 = p->vTerInfo->pArray[(uint)iFrame];
  uVar6 = *(uint *)((long)pvVar3 + (long)(pObj->Id >> 4) * 4) >> ((char)pObj->Id * '\x02' & 0x1fU) &
          3;
  if (uVar6 != 0) {
    return uVar6;
  }
  uVar6 = (uint)*(undefined8 *)&pObj->field_0x18;
  uVar11 = uVar6 & 7;
  if (uVar11 == 3) {
    uVar11 = Saig_ManBmcRunTerSim_rec
                       (p,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),iFrame);
    uVar6 = uVar11;
    if (((ulong)pObj->pFanin0 & 1) != 0) {
      uVar6 = 2;
      if (uVar11 != 1) {
        uVar6 = (uint)(uVar11 != 2) * 2 + 1;
      }
    }
  }
  else {
    if (uVar11 == 2) {
      pAVar4 = p->pAig;
      if (pAVar4->nTruePis <= (pObj->field_0).CioId) {
        if (iFrame == 0) {
          __assert_fail("iFrame > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmc3.c"
                        ,0x4c6,"int Saig_ManBmcRunTerSim_rec(Gia_ManBmc_t *, Aig_Obj_t *, int)");
        }
        uVar6 = ((pObj->field_0).CioId - pAVar4->nTruePis) + pAVar4->nTruePos;
        if (((int)uVar6 < 0) || (pAVar4->vCos->nSize <= (int)uVar6)) goto LAB_00569a15;
        uVar6 = Saig_ManBmcRunTerSim_rec(p,(Aig_Obj_t *)pAVar4->vCos->pArray[uVar6],iFrame + -1);
        goto LAB_005699a4;
      }
    }
    if ((uVar6 & 7) - 7 < 0xfffffffe) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmc3.c"
                    ,0x4d3,"int Saig_ManBmcRunTerSim_rec(Gia_ManBmc_t *, Aig_Obj_t *, int)");
    }
    iVar7 = Saig_ManBmcRunTerSim_rec
                      (p,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),iFrame);
    iVar8 = Saig_ManBmcRunTerSim_rec
                      (p,(Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe),iFrame);
    iVar1 = (uint)(iVar7 != 2) * 2 + 1;
    if (iVar7 == 1) {
      iVar1 = 2;
    }
    if (((ulong)pObj->pFanin0 & 1) == 0) {
      iVar1 = iVar7;
    }
    iVar7 = (uint)(iVar8 != 2) * 2 + 1;
    if (iVar8 == 1) {
      iVar7 = 2;
    }
    if (((ulong)pObj->pFanin1 & 1) == 0) {
      iVar7 = iVar8;
    }
    uVar6 = (iVar7 == 2 && iVar1 == 2) ^ 3;
    if (iVar7 == 1) {
      uVar6 = 1;
    }
    if (iVar1 == 1) {
      uVar6 = 1;
    }
  }
LAB_005699a4:
  lVar10 = (long)(pObj->Id >> 4);
  uVar11 = *(uint *)((long)pvVar3 + lVar10 * 4);
  bVar5 = (char)pObj->Id * '\x02';
  *(uint *)((long)pvVar3 + lVar10 * 4) =
       (uVar11 >> (bVar5 & 0x1f) & 3 ^ uVar6) << (bVar5 & 0x1f) ^ uVar11;
  iVar1 = pObj->Id;
  if (-1 < (long)iVar1) {
    uVar11 = p->vMapping->nSize;
    if (iVar1 < (int)uVar11) {
      uVar2 = p->vMapping->pArray[iVar1];
      uVar9 = uVar6;
      if (uVar2 != 0) {
        if (((int)uVar2 < 0) || (uVar11 <= uVar2)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
        }
        uVar9 = 3;
        if (uVar6 != 3) {
          Saig_ManBmcSetLiteral(p,pObj,iFrame,(uint)(uVar6 == 2));
          uVar9 = uVar6;
        }
      }
      return uVar9;
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

int Saig_ManBmcRunTerSim_rec( Gia_ManBmc_t * p, Aig_Obj_t * pObj, int iFrame )
{
    unsigned * pInfo = (unsigned *)Vec_PtrEntry( p->vTerInfo, iFrame );
    int Val0, Val1, Value = Saig_ManBmcSimInfoGet( pInfo, pObj );
    if ( Value != SAIG_TER_NON )
    {
/*
        // check the value of this literal in the SAT solver
        if ( Value == SAIG_TER_UND && Saig_ManBmcMapping(p, pObj) )
        {
            int Lit = Saig_ManBmcLiteral( p, pObj, iFrame );
            if ( Lit >= 0  )
            {
                assert( Lit >= 2 );
                if ( p->pSat->assigns[Abc_Lit2Var(Lit)] < 2 )
                {
                    p->nUniProps++;
                    if ( Abc_LitIsCompl(Lit) ^ (p->pSat->assigns[Abc_Lit2Var(Lit)] == 0) )
                        Value = SAIG_TER_ONE;
                    else
                        Value = SAIG_TER_ZER;

//                    Value = SAIG_TER_UND;  // disable!

                    // use the new value
                    Saig_ManBmcSimInfoSet( pInfo, pObj, Value );
                    // transfer to the unrolling
                    if ( Value != SAIG_TER_UND )
                        Saig_ManBmcSetLiteral( p, pObj, iFrame, (int)(Value == SAIG_TER_ONE) );
                }
            }
        }
*/
        return Value;
    }
    if ( Aig_ObjIsCo(pObj) )
    {
        Value = Saig_ManBmcRunTerSim_rec( p, Aig_ObjFanin0(pObj), iFrame );
        if ( Aig_ObjFaninC0(pObj) )
            Value = Saig_ManBmcSimInfoNot( Value );
    }
    else if ( Saig_ObjIsLo(p->pAig, pObj) )
    {
        assert( iFrame > 0 );
        Value = Saig_ManBmcRunTerSim_rec( p, Saig_ObjLoToLi(p->pAig, pObj), iFrame - 1 );
    }
    else if ( Aig_ObjIsNode(pObj) )
    {
        Val0 = Saig_ManBmcRunTerSim_rec( p, Aig_ObjFanin0(pObj), iFrame  );
        Val1 = Saig_ManBmcRunTerSim_rec( p, Aig_ObjFanin1(pObj), iFrame  );
        if ( Aig_ObjFaninC0(pObj) )
            Val0 = Saig_ManBmcSimInfoNot( Val0 );
        if ( Aig_ObjFaninC1(pObj) )
            Val1 = Saig_ManBmcSimInfoNot( Val1 );
        Value = Saig_ManBmcSimInfoAnd( Val0, Val1 );
    }
    else assert( 0 );
    Saig_ManBmcSimInfoSet( pInfo, pObj, Value );
    // transfer to the unrolling
    if ( Saig_ManBmcMapping(p, pObj) && Value != SAIG_TER_UND )
        Saig_ManBmcSetLiteral( p, pObj, iFrame, (int)(Value == SAIG_TER_ONE) );
    return Value;
}